

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.h
# Opt level: O1

void __thiscall Token::Token(Token *this,string *_content)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  char *pcVar4;
  undefined8 uVar5;
  ulong uVar6;
  ulong uVar7;
  runtime_error *this_00;
  Type TVar8;
  ulong uVar9;
  
  paVar1 = &(this->content).field_2;
  (this->content)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (_content->_M_dataplus)._M_p;
  paVar2 = &_content->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar5 = *(undefined8 *)((long)&_content->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->content).field_2 + 8) = uVar5;
  }
  else {
    (this->content)._M_dataplus._M_p = pcVar3;
    (this->content).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->content)._M_string_length = _content->_M_string_length;
  (_content->_M_dataplus)._M_p = (pointer)paVar2;
  _content->_M_string_length = 0;
  (_content->field_2)._M_local_buf[0] = '\0';
  for (uVar7 = std::__cxx11::string::find((char *)this,0x17720c,0); uVar7 != 0xffffffffffffffff;
      uVar7 = std::__cxx11::string::find((char *)this,0x17720c,uVar7 + 1)) {
    std::__cxx11::string::replace((ulong)this,uVar7,(char *)0x3,0x176f4a);
  }
  pcVar4 = (this->content)._M_dataplus._M_p;
  uVar7 = (this->content)._M_string_length;
  if ((4 < uVar7) && (*pcVar4 == 's')) {
    uVar6 = 0;
    do {
      uVar9 = uVar6;
      if (uVar9 == 4) break;
      uVar6 = uVar9 + 1;
    } while ("std::"[uVar9 + 1] == pcVar4[uVar9 + 1]);
    if (3 < uVar9) {
      TVar8 = std;
      stripToken(this);
      goto LAB_0014c756;
    }
  }
  if ((uVar7 == 0) || (TVar8 = header, *pcVar4 != '<')) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"unknown token");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
LAB_0014c756:
  this->type = TVar8;
  return;
}

Assistant:

Token(std::string _content) :
            content(std::move(_content)) {
        str::replace_all(content, "%3A", ":");

        if (str::starts_with(content, "std::")) {
            stripToken();
            type = Type::std;
        } else if (str::starts_with(content, "<")) {
            type = Type::header;
        } else {
            throw std::runtime_error("unknown token");
        }
    }